

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O1

int __thiscall
ncnn::LSTM::forward(LSTM *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  int iVar1;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  pointer pMVar2;
  int *piVar3;
  int iVar4;
  size_t sVar5;
  void *in_R8;
  int _h_00;
  void *__dest;
  ulong uVar6;
  void *__src;
  bool bVar7;
  Mat m;
  int local_33c;
  Mat local_338;
  Mat local_2e8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2a0;
  Mat cell1;
  Mat hidden1;
  Mat m_1;
  Mat m_2;
  Mat cell0;
  Mat m_5;
  Mat local_c0;
  Mat local_78;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar1 = this->direction;
  local_2e8.cstep = 0;
  local_2e8.data = (void *)0x0;
  local_2e8.refcount._0_4_ = 0;
  local_2e8.refcount._4_4_ = 0;
  local_2e8.elemsize._0_4_ = 0;
  local_2e8.elemsize._4_4_ = 0;
  local_2e8.elempack = 0;
  local_2e8.allocator = (Allocator *)0x0;
  local_2e8.dims = 0;
  local_2e8.w = 0;
  local_2e8.h = 0;
  local_2e8.d = 0;
  local_2e8.c = 0;
  local_338.cstep = 0;
  local_338.data = (void *)0x0;
  local_338.refcount._0_4_ = 0;
  local_338.refcount._4_4_ = 0;
  local_338.elemsize._0_4_ = 0;
  local_338.elemsize._4_4_ = 0;
  local_338.elempack = 0;
  local_338.allocator = (Allocator *)0x0;
  local_338.dims = 0;
  local_338.w = 0;
  local_338.h = 0;
  local_338.d = 0;
  local_338.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0xd8];
  local_2a0 = top_blobs;
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,0xd8,in_R8);
    piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_2e8.allocator == (Allocator *)0x0) {
          if (local_2e8.data != (void *)0x0) {
            free(local_2e8.data);
          }
        }
        else {
          (*(local_2e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_2e8.data = m.data;
    local_2e8.refcount._0_4_ = m.refcount._0_4_;
    local_2e8.refcount._4_4_ = m.refcount._4_4_;
    local_2e8.elemsize._0_4_ = (undefined4)m.elemsize;
    local_2e8.elemsize._4_4_ = m.elemsize._4_4_;
    local_2e8.elempack = m.elempack;
    local_2e8.allocator = m.allocator;
    local_2e8.dims = m.dims;
    local_2e8.w = m.w;
    local_2e8.h = m.h;
    local_2e8.c = m.c;
    local_2e8.d = m.d;
    local_2e8.cstep = m.cstep;
    sVar5 = m.cstep;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
            sVar5 = m.cstep;
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
          sVar5 = m.cstep;
        }
      }
    }
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    Mat::clone(&m,(__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar5,
               in_R8);
    piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (int *)CONCAT44(local_338.refcount._4_4_,local_338.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_338.allocator == (Allocator *)0x0) {
          if (local_338.data != (void *)0x0) {
            free(local_338.data);
          }
        }
        else {
          (*(local_338.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_338.data = m.data;
    local_338.refcount._0_4_ = m.refcount._0_4_;
    local_338.refcount._4_4_ = m.refcount._4_4_;
    local_338.elemsize._0_4_ = (undefined4)m.elemsize;
    local_338.elemsize._4_4_ = m.elemsize._4_4_;
    local_338.elempack = m.elempack;
    local_338.allocator = m.allocator;
    local_338.dims = m.dims;
    local_338.w = m.w;
    local_338.h = m.h;
    local_338.d = m.d;
    local_338.c = m.c;
    local_338.cstep = m.cstep;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
  }
  else {
    _h_00 = (iVar1 == 2) + 1;
    Mat::create(&local_2e8,this->num_output,_h_00,4,_allocator);
    iVar4 = -100;
    if ((local_2e8.data == (void *)0x0) || ((long)local_2e8.c * local_2e8.cstep == 0))
    goto LAB_002238ec;
    if (0 < local_2e8.c * (int)local_2e8.cstep) {
      memset(local_2e8.data,0,(ulong)(uint)(local_2e8.c * (int)local_2e8.cstep) << 2);
    }
    Mat::create(&local_338,this->num_output,_h_00,4,_allocator);
    if ((local_338.data == (void *)0x0) || ((long)local_338.c * local_338.cstep == 0))
    goto LAB_002238ec;
    if (0 < local_338.c * (int)local_338.cstep) {
      memset(local_338.data,0,(ulong)(uint)(local_338.c * (int)local_338.cstep) << 2);
    }
  }
  this_00 = (local_2a0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
  iVar4 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    if ((uint)this->direction < 2) {
      bVar7 = (this->weight_xc_data).dims == 3;
      m.w = (this->weight_xc_data).w;
      m.h = (this->weight_xc_data).h;
      m.c = 1;
      if (!bVar7) {
        m.c = (this->weight_xc_data).d;
      }
      m.dims = bVar7 ^ 3;
      m.allocator = (this->weight_xc_data).allocator;
      m.elempack = (this->weight_xc_data).elempack;
      m.data = (this->weight_xc_data).data;
      sVar5 = (this->weight_xc_data).elemsize;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)sVar5;
      m.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
      m.d = 1;
      m.cstep = (long)m.h * (long)m.w;
      bVar7 = (this->bias_c_data).dims == 3;
      m_1.w = (this->bias_c_data).w;
      m_1.h = (this->bias_c_data).h;
      m_1.c = 1;
      if (!bVar7) {
        m_1.c = (this->bias_c_data).d;
      }
      m_1.dims = bVar7 ^ 3;
      m_1.allocator = (this->bias_c_data).allocator;
      m_1.elempack = (this->bias_c_data).elempack;
      m_1.data = (this->bias_c_data).data;
      sVar5 = (this->bias_c_data).elemsize;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)sVar5;
      m_1.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
      m_1.d = 1;
      m_1.cstep = (long)m_1.h * (long)m_1.w;
      bVar7 = (this->weight_hc_data).dims == 3;
      iVar1 = (this->weight_hc_data).w;
      m_2.h = (this->weight_hc_data).h;
      m_2.c = 1;
      if (!bVar7) {
        m_2.c = (this->weight_hc_data).d;
      }
      m_2.allocator = (this->weight_hc_data).allocator;
      m_2.elempack = (this->weight_hc_data).elempack;
      m_2.data = (this->weight_hc_data).data;
      sVar5 = (this->weight_hc_data).elemsize;
      m_2.refcount._0_4_ = 0;
      m_2.refcount._4_4_ = 0;
      m_2.elemsize._0_4_ = (undefined4)sVar5;
      m_2.elemsize._4_4_ = (undefined4)(sVar5 >> 0x20);
      m_2._40_8_ = CONCAT44(iVar1,(uint)bVar7) ^ 3;
      m_2.d = 1;
      m_2.cstep = (long)m_2.h * (long)iVar1;
      iVar4 = lstm(bottom_blob,this_00,this->direction,&m,&m_1,&m_2,&local_2e8,&local_338,opt);
      piVar3 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (m_2.allocator == (Allocator *)0x0) {
            if (m_2.data != (void *)0x0) {
              free(m_2.data);
            }
          }
          else {
            (*(m_2.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_33c = iVar4;
      if (iVar4 != 0) goto LAB_002238ec;
    }
    if (this->direction == 2) {
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      Mat::create(&m,this->num_output,_h,4,opt->workspace_allocator);
      iVar4 = -100;
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
        bVar7 = false;
      }
      else {
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.allocator = (Allocator *)0x0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        Mat::create(&m_1,this->num_output,_h,4,opt->workspace_allocator);
        iVar4 = -100;
        if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
          bVar7 = false;
        }
        else {
          m_2.cstep = (size_t)local_2e8.w;
          m_2.data = local_2e8.data;
          m_2.refcount._0_4_ = 0;
          m_2.refcount._4_4_ = 0;
          m_2.elemsize._0_4_ = (undefined4)local_2e8.elemsize;
          m_2.elemsize._4_4_ = local_2e8.elemsize._4_4_;
          m_2.elempack = local_2e8.elempack;
          m_2.allocator = local_2e8.allocator;
          m_2.w = local_2e8.w;
          m_2.dims = 2;
          m_2.h = 1;
          m_2.d = 1;
          m_2.c = 1;
          cell0.cstep = (size_t)local_338.w;
          cell0.data = local_338.data;
          cell0.refcount._0_4_ = 0;
          cell0.refcount._4_4_ = 0;
          cell0.elemsize._0_4_ = (undefined4)local_338.elemsize;
          cell0.elemsize._4_4_ = local_338.elemsize._4_4_;
          cell0.elempack = local_338.elempack;
          cell0.allocator = local_338.allocator;
          cell0.w = local_338.w;
          cell0.dims = 2;
          cell0.h = 1;
          cell0.d = 1;
          cell0.c = 1;
          bVar7 = (this->weight_xc_data).dims == 3;
          hidden1.w = (this->weight_xc_data).w;
          hidden1.h = (this->weight_xc_data).h;
          hidden1.c = 1;
          if (!bVar7) {
            hidden1.c = (this->weight_xc_data).d;
          }
          hidden1.dims = bVar7 ^ 3;
          hidden1.allocator = (this->weight_xc_data).allocator;
          hidden1.elempack = (this->weight_xc_data).elempack;
          hidden1.data = (this->weight_xc_data).data;
          hidden1.elemsize = (this->weight_xc_data).elemsize;
          hidden1.refcount = (int *)0x0;
          hidden1.d = 1;
          hidden1.cstep = (long)hidden1.h * (long)hidden1.w;
          bVar7 = (this->bias_c_data).dims == 3;
          cell1.w = (this->bias_c_data).w;
          cell1.h = (this->bias_c_data).h;
          cell1.c = 1;
          if (!bVar7) {
            cell1.c = (this->bias_c_data).d;
          }
          cell1.dims = bVar7 ^ 3;
          cell1.allocator = (this->bias_c_data).allocator;
          cell1.elempack = (this->bias_c_data).elempack;
          cell1.data = (this->bias_c_data).data;
          cell1.elemsize = (this->bias_c_data).elemsize;
          cell1.refcount = (int *)0x0;
          cell1.d = 1;
          cell1.cstep = (long)cell1.h * (long)cell1.w;
          bVar7 = (this->weight_hc_data).dims == 3;
          m_5.w = (this->weight_hc_data).w;
          m_5.h = (this->weight_hc_data).h;
          m_5.c = 1;
          if (!bVar7) {
            m_5.c = (this->weight_hc_data).d;
          }
          m_5.dims = bVar7 ^ 3;
          m_5.allocator = (this->weight_hc_data).allocator;
          m_5.elempack = (this->weight_hc_data).elempack;
          m_5.data = (this->weight_hc_data).data;
          m_5.elemsize = (this->weight_hc_data).elemsize;
          m_5.refcount = (int *)0x0;
          m_5.d = 1;
          m_5.cstep = (long)m_5.h * (long)m_5.w;
          iVar4 = lstm(bottom_blob,&m,0,&hidden1,&cell1,&m_5,&m_2,&cell0,opt);
          if (m_5.refcount != (int *)0x0) {
            LOCK();
            *m_5.refcount = *m_5.refcount + -1;
            UNLOCK();
            if (*m_5.refcount == 0) {
              if (m_5.allocator == (Allocator *)0x0) {
                if (m_5.data != (void *)0x0) {
                  free(m_5.data);
                }
              }
              else {
                (*(m_5.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (cell1.refcount != (int *)0x0) {
            LOCK();
            *cell1.refcount = *cell1.refcount + -1;
            UNLOCK();
            if (*cell1.refcount == 0) {
              if (cell1.allocator == (Allocator *)0x0) {
                if (cell1.data != (void *)0x0) {
                  free(cell1.data);
                }
              }
              else {
                (*(cell1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (hidden1.refcount != (int *)0x0) {
            LOCK();
            *hidden1.refcount = *hidden1.refcount + -1;
            UNLOCK();
            if (*hidden1.refcount == 0) {
              if (hidden1.allocator == (Allocator *)0x0) {
                if (hidden1.data != (void *)0x0) {
                  free(hidden1.data);
                }
              }
              else {
                (*(hidden1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (iVar4 == 0) {
            hidden1.cstep = (size_t)local_2e8.w;
            hidden1.elemsize = CONCAT44(local_2e8.elemsize._4_4_,(undefined4)local_2e8.elemsize);
            hidden1.data = (void *)(hidden1.elemsize * hidden1.cstep + (long)local_2e8.data);
            hidden1.refcount = (int *)0x0;
            hidden1.elempack = local_2e8.elempack;
            hidden1.allocator = local_2e8.allocator;
            hidden1.dims = 2;
            hidden1.w = local_2e8.w;
            hidden1.h = 1;
            hidden1.d = 1;
            hidden1.c = 1;
            cell1.cstep = (size_t)local_338.w;
            cell1.elemsize = CONCAT44(local_338.elemsize._4_4_,(undefined4)local_338.elemsize);
            cell1.data = (void *)(cell1.elemsize * cell1.cstep + (long)local_338.data);
            cell1.refcount = (int *)0x0;
            cell1.elempack = local_338.elempack;
            cell1.allocator = local_338.allocator;
            cell1.dims = 2;
            cell1.w = local_338.w;
            cell1.h = 1;
            cell1.d = 1;
            cell1.c = 1;
            Mat::channel(&m_5,&this->weight_xc_data,1);
            Mat::channel(&local_78,&this->bias_c_data,1);
            Mat::channel(&local_c0,&this->weight_hc_data,1);
            iVar4 = lstm(bottom_blob,&m_1,1,&m_5,&local_78,&local_c0,&hidden1,&cell1,opt);
            Mat::~Mat(&local_c0);
            Mat::~Mat(&local_78);
            Mat::~Mat(&m_5);
            bVar7 = iVar4 == 0;
            if ((bVar7) && (iVar4 = local_33c, 0 < (int)_h)) {
              uVar6 = 0;
              do {
                __src = (void *)((long)m_1.w * uVar6 *
                                 CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                (long)m_1.data);
                __dest = (void *)((long)this_00->w * uVar6 * this_00->elemsize + (long)this_00->data
                                 );
                memcpy(__dest,(void *)((long)m.w * uVar6 *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                      (long)m.data),(long)this->num_output << 2);
                memcpy((void *)((long)__dest + (long)this->num_output * 4),__src,
                       (long)this->num_output << 2);
                uVar6 = uVar6 + 1;
              } while (_h != uVar6);
            }
            Mat::~Mat(&cell1);
            Mat::~Mat(&hidden1);
          }
          else {
            bVar7 = false;
          }
          piVar3 = (int *)CONCAT44(cell0.refcount._4_4_,cell0.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (cell0.allocator == (Allocator *)0x0) {
                if (cell0.data != (void *)0x0) {
                  free(cell0.data);
                }
              }
              else {
                (*(cell0.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          cell0.cstep = 0;
          cell0.data = (void *)0x0;
          cell0.refcount._0_4_ = 0;
          cell0.refcount._4_4_ = 0;
          cell0.elemsize._0_4_ = 0;
          cell0.elemsize._4_4_ = 0;
          cell0.elempack = 0;
          cell0.dims = 0;
          cell0.w = 0;
          cell0.h = 0;
          cell0.d = 0;
          cell0.c = 0;
          piVar3 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                if (m_2.data != (void *)0x0) {
                  free(m_2.data);
                }
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_2.cstep = 0;
          m_2.data = (void *)0x0;
          m_2.refcount._0_4_ = 0;
          m_2.refcount._4_4_ = 0;
          m_2.elemsize._0_4_ = 0;
          m_2.elemsize._4_4_ = 0;
          m_2.elempack = 0;
          m_2.dims = 0;
          m_2.w = 0;
          m_2.h = 0;
          m_2.d = 0;
          m_2.c = 0;
        }
        piVar3 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar7) goto LAB_002238ec;
    }
    pMVar2 = (local_2a0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = 0;
    if ((long)(local_2a0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar2 == 0xd8) {
      if (pMVar2 + 1 != &local_2e8) {
        piVar3 = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = pMVar2[1].refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (pMVar2[1].allocator == (Allocator *)0x0) {
              if (pMVar2[1].data != (void *)0x0) {
                free(pMVar2[1].data);
              }
            }
            else {
              (*(pMVar2[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar2[1].cstep = 0;
        *(undefined8 *)((long)&pMVar2[1].refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar2[1].elemsize + 4) = 0;
        pMVar2[1].data = (void *)0x0;
        pMVar2[1].refcount = (int *)0x0;
        pMVar2[1].dims = 0;
        pMVar2[1].w = 0;
        pMVar2[1].h = 0;
        pMVar2[1].d = 0;
        pMVar2[1].c = 0;
        pMVar2[1].data = local_2e8.data;
        pMVar2[1].refcount = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
        pMVar2[1].elemsize = CONCAT44(local_2e8.elemsize._4_4_,(undefined4)local_2e8.elemsize);
        pMVar2[1].elempack = local_2e8.elempack;
        pMVar2[1].allocator = local_2e8.allocator;
        pMVar2[1].dims = local_2e8.dims;
        pMVar2[1].w = local_2e8.w;
        pMVar2[1].h = local_2e8.h;
        pMVar2[1].d = local_2e8.d;
        pMVar2[1].c = local_2e8.c;
        pMVar2[1].cstep = local_2e8.cstep;
      }
      pMVar2 = (local_2a0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pMVar2 + 2 != &local_338) {
        piVar3 = (int *)CONCAT44(local_338.refcount._4_4_,local_338.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = pMVar2[2].refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (pMVar2[2].allocator == (Allocator *)0x0) {
              if (pMVar2[2].data != (void *)0x0) {
                free(pMVar2[2].data);
              }
            }
            else {
              (*(pMVar2[2].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar2[2].cstep = 0;
        *(undefined8 *)((long)&pMVar2[2].refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar2[2].elemsize + 4) = 0;
        pMVar2[2].data = (void *)0x0;
        pMVar2[2].refcount = (int *)0x0;
        pMVar2[2].dims = 0;
        pMVar2[2].w = 0;
        pMVar2[2].h = 0;
        pMVar2[2].d = 0;
        pMVar2[2].c = 0;
        pMVar2[2].data = local_338.data;
        pMVar2[2].refcount = (int *)CONCAT44(local_338.refcount._4_4_,local_338.refcount._0_4_);
        pMVar2[2].elemsize = CONCAT44(local_338.elemsize._4_4_,(undefined4)local_338.elemsize);
        pMVar2[2].elempack = local_338.elempack;
        pMVar2[2].allocator = local_338.allocator;
        pMVar2[2].dims = local_338.dims;
        pMVar2[2].w = local_338.w;
        pMVar2[2].h = local_338.h;
        pMVar2[2].d = local_338.d;
        pMVar2[2].c = local_338.c;
        pMVar2[2].cstep = local_338.cstep;
      }
    }
  }
LAB_002238ec:
  piVar3 = (int *)CONCAT44(local_338.refcount._4_4_,local_338.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_338.allocator == (Allocator *)0x0) {
        if (local_338.data != (void *)0x0) {
          free(local_338.data);
        }
      }
      else {
        (*(local_338.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_2e8.allocator == (Allocator *)0x0) {
        if (local_2e8.data != (void *)0x0) {
          free(local_2e8.data);
        }
      }
      else {
        (*(local_2e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar4;
}

Assistant:

int LSTM::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, cell0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, cell1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}